

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O1

void __thiscall AsyncLogging::AsyncLogging(AsyncLogging *this,string *logName,int flushInterval)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MutexLock *pMVar2;
  pointer pcVar3;
  FixedBuffer<4000000> *__p;
  string local_a0;
  string *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  Thread *local_70;
  MutexLock *local_68;
  pthread_cond_t *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->flushInterval_ = flushInterval;
  this->running_ = false;
  paVar1 = &(this->basename_).field_2;
  (this->basename_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (logName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->basename_,pcVar3,pcVar3 + logName->_M_string_length);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_80 = &this->basename_;
  local_78 = paVar1;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = threadFunc;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(AsyncLogging **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(AsyncLogging::*(AsyncLogging_*))()>_>::
               _M_invoke;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(AsyncLogging::*(AsyncLogging_*))()>_>
             ::_M_manager;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Logging","");
  local_70 = &this->thread_;
  Thread::Thread(local_70,(ThreadFunc *)&local_58,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pMVar2 = &this->mutex_;
  pthread_mutex_init((pthread_mutex_t *)pMVar2,(pthread_mutexattr_t *)0x0);
  (this->cond_).mutex = pMVar2;
  local_60 = &(this->cond_).cond;
  local_68 = pMVar2;
  pthread_cond_init((pthread_cond_t *)local_60,(pthread_condattr_t *)0x0);
  __p = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  __p->cur_ = (char *)__p;
  (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (&(this->currentBuffer_).
              super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p);
  pMVar2 = &(this->latch_).mutex_;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pthread_mutex_init((pthread_mutex_t *)pMVar2,(pthread_mutexattr_t *)0x0);
  (this->latch_).condition_.mutex = pMVar2;
  pthread_cond_init((pthread_cond_t *)&(this->latch_).condition_.cond,(pthread_condattr_t *)0x0);
  (this->latch_).count_ = 1;
  if (1 < logName->_M_string_length) {
    memset((this->currentBuffer_).
           super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,4000000);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::reserve(&this->buffers_,0x10);
    return;
  }
  __assert_fail("logName.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                ,0x10,"AsyncLogging::AsyncLogging(std::string, int)");
}

Assistant:

AsyncLogging::AsyncLogging(std::string logName, int flushInterval) 
    : flushInterval_(flushInterval),
      running_(false),
      basename_(logName),
      thread_(std::bind(&AsyncLogging::threadFunc, this), "Logging"),
      mutex_(),
      cond_(mutex_), 
      currentBuffer_(new Buffer),
      buffers_(),
      latch_(1) {
    assert(logName.size() > 1);
    currentBuffer_->bzero();
    buffers_.reserve(16);
}